

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

bool __thiscall
ON_SubDMeshFragment::SetUnmanagedVertexCapacityForExperts
          (ON_SubDMeshFragment *this,size_t vertex_capacity)

{
  ushort uVar1;
  bool bVar2;
  unsigned_short etc;
  size_t vertex_capacity_local;
  ON_SubDMeshFragment *this_local;
  
  if (vertex_capacity < 0x1001) {
    bVar2 = ManagedArrays(this);
    if (bVar2) {
      ON_SubDIncrementErrorCount();
      this_local._7_1_ = false;
    }
    else {
      uVar1 = this->m_vertex_capacity_etc;
      this->m_vertex_capacity_etc = uVar1 & 0xe000;
      this->m_vertex_capacity_etc = (ushort)vertex_capacity | uVar1 & 0x6000;
      this_local._7_1_ = true;
    }
  }
  else {
    ON_SubDIncrementErrorCount();
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SubDMeshFragment::SetUnmanagedVertexCapacityForExperts(size_t vertex_capacity)
{
  // Do not check for a non-null m_P.
  // This function is used in expert situations when m_P is null.
  if (vertex_capacity < 0 || vertex_capacity > (size_t)ON_SubDMeshFragment::MaximumVertexCount)
    return ON_SUBD_RETURN_ERROR(false);
  if (ManagedArrays())
  {
    // attempting to convert internally managed memory to externally managed memory
    return ON_SUBD_RETURN_ERROR(false);
  }
  unsigned short etc = m_vertex_capacity_etc &= ON_SubDMeshFragment::EtcMask;
  etc &= ~ON_SubDMeshFragment::EtcManagedArraysBit;
  m_vertex_capacity_etc = ((unsigned short)vertex_capacity) | etc;
  return true;
}